

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O0

void __thiscall
soplex::
SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
::add<double>(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              *this,SVSetBase<double> *pset)

{
  int iVar1;
  int iVar2;
  SVectorBase<double> *pSVar3;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_RSI;
  undefined8 in_RDI;
  bool in_stack_0000001b;
  int len;
  int n;
  int i;
  int in_stack_ffffffffffffffcc;
  SVSetBase<double> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  int iVar5;
  
  iVar1 = soplex::SVSetBase<double>::num((SVSetBase<double> *)0x452e62);
  iVar4 = 0;
  for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
    pSVar3 = soplex::SVSetBase<double>::operator[]
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    iVar2 = SVectorBase<double>::size(pSVar3);
    iVar4 = iVar2 + iVar4;
  }
  ensurePSVec((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),(int)((ulong)in_RDI >> 0x20));
  ensureMem(_n,len,in_stack_0000001b);
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    in_stack_ffffffffffffffd0 =
         (SVSetBase<double> *)
         soplex::SVSetBase<double>::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    pSVar3 = soplex::SVSetBase<double>::operator[]
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    SVectorBase<double>::size(pSVar3);
    create(in_RSI,iVar4);
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
    ::operator=((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)in_RSI,(SVectorBase<double> *)CONCAT44(iVar4,iVar1));
  }
  return;
}

Assistant:

void add(const SVSetBase<S>& pset)
   {
      int i;
      int n;
      int len;

      n = pset.num();

      for(i = len = 0; i < n; ++i)
         len += pset[i].size();

      ensurePSVec(n);
      ensureMem(len);

      for(i = 0; i < n; ++i)
         *create(pset[i].size()) = pset[i];
   }